

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.c
# Opt level: O0

ZyanBool ZydisCheckOsz(ZydisEncoderInstructionMatch *match,ZydisRegisterWidth reg_width)

{
  ZydisRegisterWidth reg_width_local;
  ZydisEncoderInstructionMatch *match_local;
  
  if (0xff < reg_width) {
    __assert_fail("reg_width <= (255)",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                  ,0x29d,
                  "ZyanBool ZydisCheckOsz(ZydisEncoderInstructionMatch *, ZydisRegisterWidth)");
  }
  if (match->eosz == '\0') {
    if (reg_width == 8) {
      match_local._7_1_ = false;
    }
    else {
      match->eosz = (ZyanU8)reg_width;
      match_local._7_1_ = true;
    }
  }
  else {
    match_local._7_1_ = match->eosz == (ZyanU8)reg_width;
  }
  return match_local._7_1_;
}

Assistant:

static ZyanBool ZydisCheckOsz(ZydisEncoderInstructionMatch *match, ZydisRegisterWidth reg_width)
{
    ZYAN_ASSERT(reg_width <= ZYAN_UINT8_MAX);
    if (match->eosz == 0)
    {
        if (reg_width == 8)
        {
            return ZYAN_FALSE;
        }
        match->eosz = (ZyanU8)reg_width;
        return ZYAN_TRUE;
    }

    return match->eosz == (ZyanU8)reg_width ? ZYAN_TRUE : ZYAN_FALSE;
}